

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O3

result<sockpp::inet6_address> *
sockpp::inet6_address::create
          (result<sockpp::inet6_address> *__return_storage_ptr__,string *saddr,in_port_t port)

{
  error_category *peVar1;
  result<in6_addr> res;
  allocator<char> local_69;
  undefined8 local_68;
  uint32_t local_60;
  anon_union_16_3_a3f0114d_for___in6_u local_58;
  int local_48;
  undefined4 uStack_44;
  error_category *peStack_40;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,(saddr->_M_dataplus)._M_p,&local_69);
  resolve_name((result<in6_addr> *)&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == 0) {
    local_68 = local_58._4_8_;
    local_60 = local_58.__u6_addr32[3];
    (__return_storage_ptr__->val_).addr_.sin6_family = 10;
    (__return_storage_ptr__->val_).addr_.sin6_port = port << 8 | port >> 8;
    *(ulong *)&(__return_storage_ptr__->val_).addr_.sin6_flowinfo =
         (ulong)local_58.__u6_addr32[0] << 0x20;
    *(undefined8 *)((long)&(__return_storage_ptr__->val_).addr_.sin6_addr.__in6_u + 4) =
         local_58._4_8_;
    (__return_storage_ptr__->val_).addr_.sin6_addr.__in6_u.__u6_addr32[3] = local_58.__u6_addr32[3];
    (__return_storage_ptr__->val_).addr_.sin6_scope_id = 0;
    (__return_storage_ptr__->err_)._M_value = 0;
    peVar1 = (error_category *)std::_V2::system_category();
    (__return_storage_ptr__->err_)._M_cat = peVar1;
  }
  else {
    *(undefined8 *)((long)&(__return_storage_ptr__->val_).addr_.sin6_addr.__in6_u + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->val_).addr_.sin6_scope_id = 0;
    (__return_storage_ptr__->val_).addr_.sin6_family = 0;
    (__return_storage_ptr__->val_).addr_.sin6_port = 0;
    (__return_storage_ptr__->val_).addr_.sin6_flowinfo = 0;
    *(undefined8 *)&(__return_storage_ptr__->val_).addr_.sin6_addr.__in6_u = 0;
    *(ulong *)&__return_storage_ptr__->err_ = CONCAT44(uStack_44,local_48);
    (__return_storage_ptr__->err_)._M_cat = peStack_40;
  }
  (__return_storage_ptr__->val_).super_sock_address._vptr_sock_address =
       (_func_int **)&PTR__sock_address_0010bb38;
  return __return_storage_ptr__;
}

Assistant:

result<inet6_address> inet6_address::create(const string& saddr, in_port_t port) {
    auto res = resolve_name(saddr.c_str());
    if (!res)
        return res.error();

    auto addr = sockaddr_in6{};
    addr.sin6_family = AF_INET6;
    addr.sin6_addr = res.value();
    addr.sin6_port = htons(port);
#if defined(__APPLE__) || defined(BSD)
    addr.sin6_len = (uint8_t)SZ;
#endif
    return inet6_address{addr};
}